

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
pbrt::BasicScene::AddSpectrumTexture(BasicScene *this,string *name,TextureSceneEntity *texture)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  ulong uVar4;
  AsyncJob<pbrt::SpectrumTexture> *pAVar5;
  mapped_type *ppAVar6;
  long in_RDX;
  long in_RDI;
  anon_class_8_1_8991fb9c_for__M_f create;
  string filename;
  lock_guard<std::mutex> lock;
  value_type *in_stack_fffffffffffff428;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>
  *in_stack_fffffffffffff430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff438;
  value_type *in_stack_fffffffffffff448;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff450;
  undefined6 in_stack_fffffffffffff460;
  undefined1 in_stack_fffffffffffff466;
  undefined1 in_stack_fffffffffffff467;
  char *in_stack_fffffffffffff468;
  key_type *__k;
  string *def;
  string *in_stack_fffffffffffff480;
  undefined7 in_stack_fffffffffffff488;
  undefined1 in_stack_fffffffffffff48f;
  string *in_stack_fffffffffffff518;
  string *in_stack_fffffffffffff640;
  TransformedSceneEntity *in_stack_fffffffffffff7e8;
  anon_class_8_1_8991fb9c_for__M_f in_stack_fffffffffffff7f0;
  _Self local_460;
  _Self local_458;
  string local_450 [39];
  undefined1 local_429 [40];
  undefined1 local_401 [33];
  string local_3e0 [32];
  string local_3c0 [36];
  undefined4 local_39c;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffff430,
             (mutex_type *)in_stack_fffffffffffff428);
  bVar1 = InternedString::operator!=
                    ((InternedString *)in_stack_fffffffffffff430,(char *)in_stack_fffffffffffff428);
  if ((bVar1) &&
     (in_stack_fffffffffffff48f =
           InternedString::operator!=
                     ((InternedString *)in_stack_fffffffffffff430,(char *)in_stack_fffffffffffff428)
     , (bool)in_stack_fffffffffffff48f)) {
    std::make_pair<std::__cxx11::string,pbrt::TransformedSceneEntity>
              (in_stack_fffffffffffff438,(TransformedSceneEntity *)in_stack_fffffffffffff430);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
    ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
                 *)in_stack_fffffffffffff430,in_stack_fffffffffffff428);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>
    ::~pair(in_stack_fffffffffffff430);
    local_39c = 1;
  }
  else {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDX + 0x20);
    def = (string *)local_401;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,in_stack_fffffffffffff468,
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffff467,
                        CONCAT16(in_stack_fffffffffffff466,in_stack_fffffffffffff460)));
    __k = (key_type *)local_429;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)__k,
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffff467,
                        CONCAT16(in_stack_fffffffffffff466,in_stack_fffffffffffff460)));
    ParameterDictionary::GetOneString
              ((ParameterDictionary *)CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488),
               in_stack_fffffffffffff480,def);
    ResolveFilename(in_stack_fffffffffffff518);
    std::__cxx11::string::~string(local_3e0);
    std::__cxx11::string::~string((string *)(local_429 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_429);
    std::__cxx11::string::~string((string *)(local_401 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_401);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::string(local_450,local_3c0);
      uVar2 = FileExists(in_stack_fffffffffffff640);
      bVar3 = uVar2 ^ 0xff;
      std::__cxx11::string::~string(local_450);
      if ((bVar3 & 1) == 0) {
        local_458._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff438,&in_stack_fffffffffffff430->first);
        local_460._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff428);
        bVar1 = std::operator!=(&local_458,&local_460);
        if (bVar1) {
          std::make_pair<std::__cxx11::string,pbrt::TransformedSceneEntity>
                    (in_stack_fffffffffffff438,(TransformedSceneEntity *)in_stack_fffffffffffff430);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
          ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
                       *)in_stack_fffffffffffff430,in_stack_fffffffffffff428);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>
          ::~pair(in_stack_fffffffffffff430);
          local_39c = 1;
        }
        else {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
          std::make_pair<std::__cxx11::string&,pbrt::TransformedSceneEntity&>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (in_RDI + 0x4a0),(TransformedSceneEntity *)in_stack_fffffffffffff430);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
          ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
                       *)in_stack_fffffffffffff430,in_stack_fffffffffffff428);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>
          ::~pair(in_stack_fffffffffffff430);
          pAVar5 = RunAsync<pbrt::BasicScene::AddSpectrumTexture(std::__cxx11::string,pbrt::TransformedSceneEntity)::__0,pbrt::TransformedSceneEntity&>
                             (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
          ppAVar6 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::SpectrumTexture>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::SpectrumTexture>_*>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::SpectrumTexture>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::SpectrumTexture>_*>_>_>
                                  *)this_00,__k);
          *ppAVar6 = pAVar5;
          local_39c = 0;
        }
      }
      else {
        Error<std::__cxx11::string&>
                  ((FileLoc *)this_00,(char *)__k,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffff460)));
        *(int *)(in_RDI + 0x548) = *(int *)(in_RDI + 0x548) + 1;
        local_39c = 1;
      }
    }
    else {
      Error((FileLoc *)in_stack_fffffffffffff430,(char *)in_stack_fffffffffffff428);
      *(int *)(in_RDI + 0x548) = *(int *)(in_RDI + 0x548) + 1;
      local_39c = 1;
    }
    std::__cxx11::string::~string(local_3c0);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x78849c);
  return;
}

Assistant:

void BasicScene::AddSpectrumTexture(std::string name, TextureSceneEntity texture) {
    std::lock_guard<std::mutex> lock(textureMutex);

    if (texture.name != "imagemap" && texture.name != "ptex") {
        serialSpectrumTextures.push_back(
            std::make_pair(std::move(name), std::move(texture)));
        return;
    }

    std::string filename =
        ResolveFilename(texture.parameters.GetOneString("filename", ""));
    if (filename.empty()) {
        Error(&texture.loc, "\"string filename\" not provided for image texture.");
        ++nMissingTextures;
        return;
    }
    if (!FileExists(filename)) {
        Error(&texture.loc, "%s: file not found.", filename);
        ++nMissingTextures;
        return;
    }

    if (loadingTextureFilenames.find(filename) != loadingTextureFilenames.end()) {
        serialSpectrumTextures.push_back(
            std::make_pair(std::move(name), std::move(texture)));
        return;
    }
    loadingTextureFilenames.insert(filename);

    asyncSpectrumTextures.push_back(std::make_pair(name, texture));

    auto create = [=](TextureSceneEntity texture) {
        Allocator alloc = threadAllocators.Get();

        pbrt::Transform renderFromTexture = texture.renderFromObject.startTransform;
        // nullptr for the textures, as with float textures.
        TextureParameterDictionary texDict(&texture.parameters, nullptr);
        // Only create SpectrumType::Albedo for now; will get the other two
        // types in CreateTextures().
        return SpectrumTexture::Create(texture.name, renderFromTexture, texDict,
                                       SpectrumType::Albedo, &texture.loc, alloc,
                                       Options->useGPU);
    };
    spectrumTextureJobs[name] = RunAsync(create, texture);
}